

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

string * format<std::__cxx11::string,std::__cxx11::string>
                   (string *__return_storage_ptr__,int fmt_num,string *fmt,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  string fmt_replaced;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string((string *)&local_50,(string *)arg);
  format<std::__cxx11::string>(&local_70,fmt_num,fmt,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string((string *)&local_90,(string *)args);
  format<std::__cxx11::string>(__return_storage_ptr__,fmt_num + 1,&local_70,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  return __return_storage_ptr__;
}

Assistant:

const std::string format (int fmt_num, const std::string& fmt, T arg, Args... args)
{
    const std::string fmt_replaced (format (fmt_num, fmt, arg));
    return format (fmt_num+1, fmt_replaced, args...);
}